

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O1

Client * __thiscall
capnp::_::anon_unknown_0::TestContext::Vat::connect<capnproto_test::capnp::test::TestInterface>
          (Client *__return_storage_ptr__,Vat *this,StringPtr to,bool unique)

{
  Reader vatId;
  CapTableBuilder *pCVar1;
  Client CVar2;
  Builder hostId;
  MallocMessageBuilder refMessage;
  Builder local_1a0;
  PointerBuilder local_188;
  StructBuilder local_170;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  MallocMessageBuilder local_118;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_118,0x80,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal(&local_1a0,&local_118.super_MessageBuilder);
  local_188.pointer = local_1a0.builder.pointer;
  local_188.segment = local_1a0.builder.segment;
  local_188.capTable = local_1a0.builder.capTable;
  PointerBuilder::initStruct(&local_170,&local_188,(StructSize)0x10001);
  local_188.segment = local_170.segment;
  local_188.capTable = local_170.capTable;
  local_188.pointer = local_170.pointers;
  PointerBuilder::setBlob<capnp::Text>(&local_188,(Reader)to.content);
  *(byte *)local_170.data = *local_170.data & 0xfe;
  StructBuilder::asReader(&local_170);
  vatId._reader.capTable = (CapTableReader *)uStack_140;
  vatId._reader.segment = (SegmentReader *)local_148;
  vatId._reader.data = (void *)local_138;
  vatId._reader.pointers = (WirePointer *)uStack_130;
  vatId._reader.dataSize = (undefined4)local_128;
  vatId._reader.pointerCount = local_128._4_2_;
  vatId._reader._38_2_ = local_128._6_2_;
  vatId._reader._40_8_ = uStack_120;
  CVar2 = RpcSystemBase::baseBootstrap((RpcSystemBase *)&local_1a0,vatId);
  (*((local_1a0.builder.capTable)->super_CapTableReader)._vptr_CapTableReader[4])
            (&local_188,local_1a0.builder.capTable,CVar2.hook.ptr);
  pCVar1 = local_1a0.builder.capTable;
  *(SegmentBuilder **)&__return_storage_ptr__->field_0x8 = local_188.segment;
  *(CapTableBuilder **)&__return_storage_ptr__->field_0x10 = local_188.capTable;
  local_188.capTable = (CapTableBuilder *)0x0;
  __return_storage_ptr__->_vptr_Client = (_func_int **)&Capability::Client::typeinfo;
  if (local_1a0.builder.capTable != (CapTableBuilder *)0x0) {
    local_1a0.builder.capTable = (CapTableBuilder *)0x0;
    (*(code *)(((local_1a0.builder.segment)->super_SegmentReader).arena)->_vptr_Arena)
              (local_1a0.builder.segment,
               (pCVar1->super_CapTableReader)._vptr_CapTableReader[-2] +
               (long)&(pCVar1->super_CapTableReader)._vptr_CapTableReader);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&local_118);
  return __return_storage_ptr__;
}

Assistant:

typename T::Client connect(kj::StringPtr to, bool unique = false) {
      MallocMessageBuilder refMessage(128);
      auto hostId = refMessage.initRoot<test::TestSturdyRefHostId>();
      hostId.setHost(to);
      hostId.setUnique(unique);
      return rpcSystem.bootstrap(hostId).castAs<T>();
    }